

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O2

int __thiscall IZDeflate::ct_tally(IZDeflate *this,int dist,int lc)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar3 = this->last_lit;
  this->last_lit = uVar3 + 1;
  this->l_buf[uVar3] = (uch)lc;
  if (dist == 0) {
    this->dyn_ltree[lc].fc.freq = this->dyn_ltree[lc].fc.freq + 1;
    bVar2 = this->flag_bit;
  }
  else {
    this->dyn_ltree[(ulong)this->length_code[lc] + 0x101].fc.freq =
         this->dyn_ltree[(ulong)this->length_code[lc] + 0x101].fc.freq + 1;
    uVar3 = dist - 1;
    uVar4 = (ulong)((uVar3 >> 7) + 0x100);
    if (dist < 0x101) {
      uVar4 = (long)(int)uVar3;
    }
    this->dyn_dtree[this->dist_code[uVar4]].fc.freq =
         this->dyn_dtree[this->dist_code[uVar4]].fc.freq + 1;
    uVar1 = this->last_dist;
    this->last_dist = uVar1 + 1;
    this->d_buf[uVar1] = (ush)uVar3;
    bVar2 = this->flag_bit;
    this->flags = this->flags | bVar2;
  }
  this->flag_bit = bVar2 * '\x02';
  uVar3 = this->last_lit;
  if ((uVar3 & 7) == 0) {
    uVar3 = this->last_flags;
    this->last_flags = uVar3 + 1;
    this->flag_buf[uVar3] = this->flags;
    this->flags = '\0';
    this->flag_bit = '\x01';
    uVar3 = this->last_lit;
  }
  if ((uVar3 & 0xfff) == 0 && 2 < this->level) {
    uVar4 = (ulong)uVar3 << 3;
    for (lVar5 = 0; lVar5 != 0x1e; lVar5 = lVar5 + 1) {
      uVar4 = uVar4 + ((long)this->extra_dbits[lVar5] + 5) * (ulong)this->dyn_dtree[lVar5].fc.freq;
    }
    if ((this->last_dist < uVar3 >> 1) &&
       (uVar4 >> 3 < (ulong)this->strstart - this->block_start >> 1)) {
      return 1;
    }
  }
  return (uint)(this->last_dist == 0x8000 || uVar3 == 0x7fff);
}

Assistant:

int IZDeflate::ct_tally (int dist, int lc)
    // int dist;  /* distance of matched string */
    // int lc;    /* match length-MIN_MATCH or unmatched char (if dist==0) */
{
    l_buf[last_lit++] = (uch)lc;
    if (dist == 0) {
        /* lc is the unmatched char */
        dyn_ltree[lc].Freq++;
    } else {
        /* Here, lc is the match length - MIN_MATCH */
        dist--;             /* dist = match distance - 1 */
        Assert((ush)dist < (ush)MAX_DIST &&
               (ush)lc <= (ush)(MAX_MATCH-MIN_MATCH) &&
               (ush)d_code(dist) < (ush)D_CODES,  "ct_tally: bad match");

        dyn_ltree[length_code[lc]+LITERALS+1].Freq++;
        dyn_dtree[d_code(dist)].Freq++;

        d_buf[last_dist++] = (ush)dist;
        flags |= flag_bit;
    }
    flag_bit <<= 1;

    /* Output the flags if they fill a byte: */
    if ((last_lit & 7) == 0) {
        flag_buf[last_flags++] = flags;
        flags = 0, flag_bit = 1;
    }
    /* Try to guess if it is profitable to stop the current block here */
    if (level > 2 && (last_lit & 0xfff) == 0) {
        /* Compute an upper bound for the compressed length */
        ulg out_length = (ulg)last_lit*8L;
        ulg in_length = (ulg)strstart-block_start;
        int dcode;
        for (dcode = 0; dcode < D_CODES; dcode++) {
            out_length += (ulg)dyn_dtree[dcode].Freq*(5L+extra_dbits[dcode]);
        }
        out_length >>= 3;
        Trace((stderr,"\nlast_lit %u, last_dist %u, in %ld, out ~%ld(%ld%%) ",
               last_lit, last_dist, in_length, out_length,
               100L - out_length*100L/in_length));
        if (last_dist < last_lit/2 && out_length < in_length/2) return 1;
    }
    return (last_lit == LIT_BUFSIZE-1 || last_dist == DIST_BUFSIZE);
    /* We avoid equality with LIT_BUFSIZE because of wraparound at 64K
     * on 16 bit machines and because stored blocks are restricted to
     * 64K-1 bytes.
     */
}